

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

IceTBoolean icetSingleImageStrategyValid(IceTEnum strategy)

{
  return strategy - 0x7001 < 4;
}

Assistant:

IceTBoolean icetSingleImageStrategyValid(IceTEnum strategy)
{
    switch(strategy) {
      case ICET_SINGLE_IMAGE_STRATEGY_AUTOMATIC:
      case ICET_SINGLE_IMAGE_STRATEGY_BSWAP:
      case ICET_SINGLE_IMAGE_STRATEGY_TREE:
      case ICET_SINGLE_IMAGE_STRATEGY_RADIXK:
          return ICET_TRUE;
      default:
          return ICET_FALSE;
    }
}